

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::compute_code(ProductQuantizer *this,real *x,uint8_t *code)

{
  int iVar1;
  ulong uVar2;
  int32_t d;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)this->nsubq_;
  if (0 < this->nsubq_) {
    d = this->dsub_;
    uVar3 = 0;
    do {
      if (uVar3 == (int)uVar2 - 1) {
        d = this->lastdsub_;
      }
      iVar1 = this->dsub_ * (int)uVar3;
      assign_centroid(this,x + iVar1,
                      (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar1 * this->ksub_,code + uVar3,d);
      uVar2 = (ulong)this->nsubq_;
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)uVar2);
  }
  return;
}

Assistant:

void ProductQuantizer::compute_code(const real* x, uint8_t* code) const {
  auto d = dsub_;
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    assign_centroid(x + m * dsub_, get_centroids(m, 0), code + m, d);
  }
}